

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::QuerySurfaceSimpleWindowCase::executeForConfig
          (QuerySurfaceSimpleWindowCase *this,EGLDisplay display,EGLConfig config)

{
  ostringstream *this_00;
  TestContext *pTVar1;
  Library *log;
  NativeDisplay *pNVar2;
  deUint32 err;
  int iVar3;
  Library *egl;
  NativeWindowFactory *pNVar4;
  undefined4 extraout_var;
  EGLSurface surface_00;
  UniqueSurface surface;
  undefined1 local_248 [120];
  ios_base local_1d0 [264];
  ConfigInfo local_c8;
  NativeWindow *window;
  
  egl = EglTestContext::getLibrary
                  ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.m_eglTestCtx
                  );
  pTVar1 = (this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
           super_TestNode.m_testCtx;
  log = (Library *)pTVar1->m_log;
  pNVar4 = eglu::selectNativeWindowFactory
                     (((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.
                      m_eglTestCtx)->m_nativeDisplayFactory,pTVar1->m_cmdLine);
  local_c8.transparentRedValue = 0;
  local_c8.transparentGreenValue = 0;
  local_c8.transparentBlueValue = 0;
  local_c8.samples = 0;
  local_c8.stencilSize = 0;
  local_c8.surfaceType = 0;
  local_c8.transparentType = 0;
  local_c8.nativeVisualId = 0;
  local_c8.nativeVisualType = 0;
  local_c8.renderableType = 0;
  local_c8.sampleBuffers = 0;
  local_c8.maxPbufferHeight = 0;
  local_c8.maxSwapInterval = 0;
  local_c8.minSwapInterval = 0;
  local_c8.nativeRenderable = 0;
  local_c8.conformant = 0;
  local_c8.depthSize = 0;
  local_c8.level = 0;
  local_c8.maxPbufferWidth = 0;
  local_c8.bindToTextureRGBA = 0;
  local_c8.colorBufferType = 0;
  local_c8.configCaveat = 0;
  local_c8.configId = 0;
  local_c8.luminanceSize = 0;
  local_c8.alphaSize = 0;
  local_c8.alphaMaskSize = 0;
  local_c8.bindToTextureRGB = 0;
  local_c8.bufferSize = 0;
  local_c8.redSize = 0;
  local_c8.greenSize = 0;
  local_c8.blueSize = 0;
  local_c8.yuvOrder = 0x3038;
  local_c8.yuvNumberOfPlanes = 0;
  local_c8.yuvSubsample = 0x3038;
  local_c8.yuvDepthRange = 0x3038;
  local_c8.yuvCscStandard = 0x3038;
  local_c8.yuvPlaneBpp = 0x331b;
  local_c8.colorComponentType = 0x3038;
  eglu::queryCoreConfigInfo(egl,display,config,&local_c8);
  this_00 = (ostringstream *)(local_248 + 8);
  local_248._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Creating window surface with config ID ",0x27);
  std::ostream::operator<<(this_00,local_c8.configId);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_1d0);
  err = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(err,"before queries",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQuerySurfaceTests.cpp"
                   ,0x13b);
  pNVar2 = (((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.m_eglTestCtx)->
           m_nativeDisplay).
           super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
           ptr;
  local_248._8_4_ =
       eglu::parseWindowVisibility
                 (((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.
                   super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_248._0_8_ = (Library *)0x4000000040;
  iVar3 = (*(pNVar4->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar4,pNVar2,display,config,0,local_248);
  window = (NativeWindow *)CONCAT44(extraout_var,iVar3);
  surface_00 = eglu::createWindowSurface
                         ((((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.
                           m_eglTestCtx)->m_nativeDisplay).
                          super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                          .m_data.ptr,window,display,config,(EGLAttrib *)0x0);
  eglu::UniqueSurface::UniqueSurface((UniqueSurface *)local_248,egl,display,surface_00);
  logSurfaceAttributes
            ((TestLog *)log,egl,display,(EGLSurface)local_248._16_8_,
             (EGLint *)
             logCommonSurfaceAttributes(tcu::TestLog&,eglw::Library_const&,void*,void*)::attributes,
             0xb);
  QuerySurfaceCase::checkCommonAttributes
            (&this->super_QuerySurfaceCase,display,(EGLSurface)local_248._16_8_,&local_c8);
  QuerySurfaceCase::checkNonPbufferAttributes
            (&this->super_QuerySurfaceCase,display,(EGLSurface)local_248._16_8_);
  eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_248);
  (*window->_vptr_NativeWindow[1])(window);
  return;
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&						egl				= m_eglTestCtx.getLibrary();
		tcu::TestLog&						log				= m_testCtx.getLog();
		const int							width			= 64;
		const int							height			= 64;
		const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
		ConfigInfo							info;

		eglu::queryCoreConfigInfo(egl, display, config, &info);

		log << TestLog::Message << "Creating window surface with config ID " << info.configId << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "before queries");

		de::UniquePtr<eglu::NativeWindow>	window	(windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(width, height, eglu::parseWindowVisibility(m_testCtx.getCommandLine()))));
		eglu::UniqueSurface					surface	(egl, display, eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, display, config, DE_NULL));

		logCommonSurfaceAttributes	(log, egl, display, *surface);
		checkCommonAttributes		(display, *surface, info);
		checkNonPbufferAttributes	(display, *surface);
	}